

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_pic.cpp
# Opt level: O0

void __thiscall
QPicturePaintEngine::updateBackground(QPicturePaintEngine *this,BGMode bgMode,QBrush *bgBrush)

{
  undefined4 uVar1;
  QPicturePaintEnginePrivate *pQVar2;
  QRectF *in_RDX;
  int in_ESI;
  QPicturePaintEngine *in_RDI;
  long in_FS_OFFSET;
  int pos;
  QPicturePaintEnginePrivate *d;
  undefined8 in_stack_ffffffffffffff48;
  quint8 qVar3;
  QColor *in_stack_ffffffffffffff50;
  QRect *this_00;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined1 corr;
  QRectF local_58;
  QRect local_38;
  QRectF local_28;
  long local_8;
  
  qVar3 = (quint8)((ulong)in_stack_ffffffffffffff48 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QPicturePaintEngine *)0x3104d9);
  pQVar2->pic_d->trecs = pQVar2->pic_d->trecs + 1;
  QDataStream::operator<<((QDataStream *)in_stack_ffffffffffffff50,qVar3);
  QDataStream::operator<<((QDataStream *)in_stack_ffffffffffffff50,qVar3);
  uVar1 = QBuffer::pos();
  qVar3 = (quint8)((ulong)&pQVar2->s >> 0x38);
  QBrush::color((QBrush *)0x310559);
  ::operator<<((QDataStream *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff50);
  this_00 = &local_38;
  QRect::QRect(this_00);
  QRectF::QRectF(&local_28,(QRect *)CONCAT44(uVar1,in_stack_ffffffffffffff58));
  writeCmdLength(in_RDI,in_ESI,in_RDX,SUB81((ulong)pQVar2 >> 0x38,0));
  pQVar2->pic_d->trecs = pQVar2->pic_d->trecs + 1;
  QDataStream::operator<<((QDataStream *)this_00,qVar3);
  QDataStream::operator<<((QDataStream *)this_00,qVar3);
  QBuffer::pos();
  QDataStream::operator<<(&pQVar2->s,(int)(char)in_ESI);
  corr = (undefined1)((ulong)pQVar2 >> 0x38);
  QRectF::QRectF(&local_58);
  writeCmdLength(in_RDI,in_ESI,in_RDX,(bool)corr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPicturePaintEngine::updateBackground(Qt::BGMode bgMode, const QBrush &bgBrush)
{
    Q_D(QPicturePaintEngine);
#ifdef QT_PICTURE_DEBUG
    qDebug() << " -> updateBackground(): mode:" << bgMode << "style:" << bgBrush.style();
#endif
    int pos;
    SERIALIZE_CMD(QPicturePrivate::PdcSetBkColor);
    d->s << bgBrush.color();
    writeCmdLength(pos, QRect(), false);

    SERIALIZE_CMD(QPicturePrivate::PdcSetBkMode);
    d->s << (qint8) bgMode;
    writeCmdLength(pos, QRectF(), false);
}